

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QString>(PromiseError *this,QString *value)

{
  QArrayDataPointer<char16_t> *this_00;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  this_00 = (QArrayDataPointer<char16_t> *)__cxa_allocate_exception(0x18);
  QArrayDataPointer<char16_t>::QArrayDataPointer(this_00,&value->d);
  __cxa_throw(this_00,&QString::typeinfo,QString::~QString);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }